

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

PipelineStage
vkt::memory::anon_unknown_0::pipelineStageFlagToPipelineStage(VkPipelineStageFlagBits flags)

{
  undefined4 local_c;
  VkPipelineStageFlagBits flags_local;
  
  if (flags == VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT) {
    local_c = PIPELINESTAGE_TOP_OF_PIPE_BIT;
  }
  else if (flags == VK_PIPELINE_STAGE_DRAW_INDIRECT_BIT) {
    local_c = PIPELINESTAGE_DRAW_INDIRECT_BIT;
  }
  else if (flags == VK_PIPELINE_STAGE_VERTEX_INPUT_BIT) {
    local_c = PIPELINESTAGE_VERTEX_INPUT_BIT;
  }
  else if (flags == VK_PIPELINE_STAGE_VERTEX_SHADER_BIT) {
    local_c = PIPELINESTAGE_VERTEX_SHADER_BIT;
  }
  else if (flags == VK_PIPELINE_STAGE_TESSELLATION_CONTROL_SHADER_BIT) {
    local_c = PIPELINESTAGE_TESSELLATION_CONTROL_SHADER_BIT;
  }
  else if (flags == VK_PIPELINE_STAGE_TESSELLATION_EVALUATION_SHADER_BIT) {
    local_c = PIPELINESTAGE_TESSELLATION_EVALUATION_SHADER_BIT;
  }
  else if (flags == VK_PIPELINE_STAGE_GEOMETRY_SHADER_BIT) {
    local_c = PIPELINESTAGE_GEOMETRY_SHADER_BIT;
  }
  else if (flags == VK_PIPELINE_STAGE_FRAGMENT_SHADER_BIT) {
    local_c = PIPELINESTAGE_FRAGMENT_SHADER_BIT;
  }
  else if (flags == VK_PIPELINE_STAGE_EARLY_FRAGMENT_TESTS_BIT) {
    local_c = PIPELINESTAGE_EARLY_FRAGMENT_TESTS_BIT;
  }
  else if (flags == VK_PIPELINE_STAGE_LATE_FRAGMENT_TESTS_BIT) {
    local_c = PIPELINESTAGE_LATE_FRAGMENT_TESTS_BIT;
  }
  else if (flags == VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT) {
    local_c = PIPELINESTAGE_COLOR_ATTACHMENT_OUTPUT_BIT;
  }
  else if (flags == VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT) {
    local_c = PIPELINESTAGE_COMPUTE_SHADER_BIT;
  }
  else if (flags == VK_PIPELINE_STAGE_TRANSFER_BIT) {
    local_c = PIPELINESTAGE_TRANSFER_BIT;
  }
  else if (flags == VK_PIPELINE_STAGE_BOTTOM_OF_PIPE_BIT) {
    local_c = PIPELINESTAGE_BOTTOM_OF_PIPE_BIT;
  }
  else if (flags == VK_PIPELINE_STAGE_HOST_BIT) {
    local_c = PIPELINESTAGE_HOST_BIT;
  }
  else {
    local_c = PIPELINESTAGE_LAST;
  }
  return local_c;
}

Assistant:

PipelineStage pipelineStageFlagToPipelineStage (vk::VkPipelineStageFlagBits flags)
{
	switch (flags)
	{
		case vk::VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT:						return PIPELINESTAGE_TOP_OF_PIPE_BIT;
		case vk::VK_PIPELINE_STAGE_BOTTOM_OF_PIPE_BIT:					return PIPELINESTAGE_BOTTOM_OF_PIPE_BIT;
		case vk::VK_PIPELINE_STAGE_DRAW_INDIRECT_BIT:					return PIPELINESTAGE_DRAW_INDIRECT_BIT;
		case vk::VK_PIPELINE_STAGE_VERTEX_INPUT_BIT:					return PIPELINESTAGE_VERTEX_INPUT_BIT;
		case vk::VK_PIPELINE_STAGE_VERTEX_SHADER_BIT:					return PIPELINESTAGE_VERTEX_SHADER_BIT;
		case vk::VK_PIPELINE_STAGE_TESSELLATION_CONTROL_SHADER_BIT:		return PIPELINESTAGE_TESSELLATION_CONTROL_SHADER_BIT;
		case vk::VK_PIPELINE_STAGE_TESSELLATION_EVALUATION_SHADER_BIT:	return PIPELINESTAGE_TESSELLATION_EVALUATION_SHADER_BIT;
		case vk::VK_PIPELINE_STAGE_GEOMETRY_SHADER_BIT:					return PIPELINESTAGE_GEOMETRY_SHADER_BIT;
		case vk::VK_PIPELINE_STAGE_FRAGMENT_SHADER_BIT:					return PIPELINESTAGE_FRAGMENT_SHADER_BIT;
		case vk::VK_PIPELINE_STAGE_EARLY_FRAGMENT_TESTS_BIT:			return PIPELINESTAGE_EARLY_FRAGMENT_TESTS_BIT;
		case vk::VK_PIPELINE_STAGE_LATE_FRAGMENT_TESTS_BIT:				return PIPELINESTAGE_LATE_FRAGMENT_TESTS_BIT;
		case vk::VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT:			return PIPELINESTAGE_COLOR_ATTACHMENT_OUTPUT_BIT;
		case vk::VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT:					return PIPELINESTAGE_COMPUTE_SHADER_BIT;
		case vk::VK_PIPELINE_STAGE_TRANSFER_BIT:						return PIPELINESTAGE_TRANSFER_BIT;
		case vk::VK_PIPELINE_STAGE_HOST_BIT:							return PIPELINESTAGE_HOST_BIT;

		default:
			DE_FATAL("Unknown pipeline stage flags");
			return PIPELINESTAGE_LAST;
	}
}